

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int normal_contentTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  ATTRIBUTE *pAVar5;
  long lVar6;
  char **ppcVar7;
  byte *pbVar8;
  uint uVar9;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  char *extraout_RDX_07;
  char *extraout_RDX_08;
  char *extraout_RDX_09;
  char *extraout_RDX_10;
  char *extraout_RDX_11;
  char *extraout_RDX_12;
  char *extraout_RDX_13;
  char *extraout_RDX_14;
  char *extraout_RDX_15;
  char *extraout_RDX_16;
  char *extraout_RDX_17;
  char *extraout_RDX_18;
  char *extraout_RDX_19;
  byte *pbVar11;
  uint uVar10;
  
  if (end <= ptr) {
    return -4;
  }
  pcVar4 = end;
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr)) {
  case 0:
  case 1:
  case 8:
    break;
  case 2:
    pbVar11 = (byte *)(ptr + 1);
    pAVar5 = (ATTRIBUTE *)(end + -(long)pbVar11);
    if ((long)pAVar5 < 1) {
      return -1;
    }
    switch(*(undefined1 *)((long)enc[1].scanners + (ulong)*pbVar11)) {
    case 5:
      if (pAVar5 == (ATTRIBUTE *)&DAT_00000001) {
        return -2;
      }
      iVar3 = (*enc[3].nameLength)(enc,(char *)pbVar11);
      if (iVar3 != 0) goto switchD_0058bf5f_caseD_8;
      iVar3 = (*enc[3].literalScanners[0])(enc,(char *)pbVar11,extraout_RDX_10,&pAVar5->name);
      lVar6 = 3;
      break;
    case 6:
      if ((long)pAVar5 < 3) {
        return -2;
      }
      pcVar4 = (*enc[3].skipS)(enc,(char *)pbVar11);
      if ((int)pcVar4 != 0) goto switchD_0058bf5f_caseD_8;
      iVar3 = (*enc[3].literalScanners[1])(enc,(char *)pbVar11,extraout_RDX_09,&pAVar5->name);
      lVar6 = 4;
      break;
    case 7:
      if ((long)pAVar5 < 4) {
        return -2;
      }
      iVar3 = (*enc[3].getAtts)(enc,(char *)pbVar11,0x74d904,pAVar5);
      if (iVar3 != 0) goto switchD_0058bf5f_caseD_8;
      iVar3 = (*enc[3].nameMatchesAscii)(enc,(char *)pbVar11,extraout_RDX_08,(char *)pAVar5);
      lVar6 = 5;
      break;
    default:
      goto switchD_0058bf5f_caseD_8;
    case 0xf:
      iVar3 = normal_scanPi(enc,ptr + 2,end,nextTokPtr);
      return iVar3;
    case 0x10:
      pbVar8 = (byte *)(ptr + 2);
      if ((byte *)end == pbVar8 || (long)end - (long)pbVar8 < 0) {
        return -1;
      }
      cVar2 = *(char *)((long)enc[1].scanners + (ulong)*pbVar8);
      if (cVar2 != '\x14') {
        if (cVar2 != '\x1b') {
          *nextTokPtr = (char *)pbVar8;
          return 0;
        }
        iVar3 = normal_scanComment(enc,ptr + 3,end,nextTokPtr);
        return iVar3;
      }
      pcVar4 = ptr + 3;
      if ((long)end - (long)pcVar4 < 6) {
        return -1;
      }
      lVar6 = 0;
      while (pcVar4[lVar6] == (&big2_scanCdataSection_CDATA_LSQB)[lVar6]) {
        lVar6 = lVar6 + 1;
        if (lVar6 == 6) {
          *nextTokPtr = ptr + 9;
          return 8;
        }
      }
      pbVar8 = (byte *)(pcVar4 + lVar6);
      goto LAB_0058c560;
    case 0x11:
      pbVar11 = (byte *)(ptr + 2);
      pAVar5 = (ATTRIBUTE *)(end + -(long)pbVar11);
      if ((long)pAVar5 < 1) {
        return -1;
      }
      bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar11);
      if (bVar1 < 0x16) {
        if (bVar1 == 5) {
          if (pAVar5 == (ATTRIBUTE *)&DAT_00000001) {
            return -2;
          }
          iVar3 = (*enc[3].nameLength)(enc,(char *)pbVar11);
          if (iVar3 != 0) goto switchD_0058bf5f_caseD_8;
          iVar3 = (*enc[3].literalScanners[0])(enc,(char *)pbVar11,extraout_RDX_12,&pAVar5->name);
          lVar6 = 4;
        }
        else if (bVar1 == 6) {
          if ((long)pAVar5 < 3) {
            return -2;
          }
          pcVar4 = (*enc[3].skipS)(enc,(char *)pbVar11);
          if ((int)pcVar4 != 0) goto switchD_0058bf5f_caseD_8;
          iVar3 = (*enc[3].literalScanners[1])(enc,(char *)pbVar11,extraout_RDX_13,&pAVar5->name);
          lVar6 = 5;
        }
        else {
          if (bVar1 != 7) goto switchD_0058bf5f_caseD_8;
          if ((long)pAVar5 < 4) {
            return -2;
          }
          iVar3 = (*enc[3].getAtts)(enc,(char *)pbVar11,0x74d904,pAVar5);
          if (iVar3 != 0) goto switchD_0058bf5f_caseD_8;
          iVar3 = (*enc[3].nameMatchesAscii)(enc,(char *)pbVar11,extraout_RDX_11,(char *)pAVar5);
          lVar6 = 6;
        }
        if (iVar3 == 0) goto switchD_0058bf5f_caseD_8;
      }
      else {
        lVar6 = 3;
        if ((bVar1 != 0x16) && (bVar1 != 0x18)) goto switchD_0058bf5f_caseD_8;
      }
      ptr = ptr + lVar6;
      do {
        lVar6 = (long)end - (long)ptr;
        if (lVar6 < 1) {
          return -1;
        }
        uVar10 = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
        uVar9 = uVar10 - 5;
        if (0x18 < uVar9) goto switchD_0058bdde_caseD_0;
        ppcVar7 = (char **)&DAT_00000001;
        switch(uVar10) {
        case 5:
          if (lVar6 == 1) {
            return -2;
          }
          iVar3 = (*enc[3].nameLength)(enc,ptr);
          if (iVar3 != 0) goto switchD_0058bdde_caseD_0;
          iVar3 = (*enc[3].scanners[0])(enc,ptr,extraout_RDX_14,ppcVar7);
          ppcVar7 = (char **)&DAT_00000002;
          break;
        case 6:
          if (lVar6 < 3) {
            return -2;
          }
          pcVar4 = (*enc[3].skipS)(enc,ptr);
          if ((int)pcVar4 != 0) goto switchD_0058bdde_caseD_0;
          iVar3 = (*enc[3].scanners[1])(enc,ptr,extraout_RDX_16,ppcVar7);
          ppcVar7 = (char **)0x3;
          break;
        case 7:
          if (lVar6 < 4) {
            return -2;
          }
          iVar3 = (*enc[3].getAtts)(enc,ptr,(&switchD_0058c46a::switchdataD_0074d954)[uVar9] +
                                            0x74d954,(ATTRIBUTE *)&DAT_00000001);
          if (iVar3 != 0) goto switchD_0058bdde_caseD_0;
          iVar3 = (*enc[3].scanners[2])(enc,ptr,extraout_RDX_15,ppcVar7);
          ppcVar7 = (char **)0x4;
          break;
        default:
          goto switchD_0058bdde_caseD_0;
        case 9:
        case 10:
        case 0x15:
          ptr = (char *)((byte *)ptr + 1);
          lVar6 = (long)end - (long)ptr;
          while( true ) {
            if (lVar6 < 1) {
              return -1;
            }
            bVar1 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
            if ((1 < bVar1 - 9) && (bVar1 != 0x15)) break;
            ptr = (char *)((byte *)ptr + 1);
            lVar6 = lVar6 + -1;
          }
          if (bVar1 != 0xb) goto switchD_0058bdde_caseD_0;
switchD_0058c46a_caseD_b:
          *nextTokPtr = (char *)((byte *)ptr + 1);
          return 5;
        case 0xb:
          goto switchD_0058c46a_caseD_b;
        case 0x16:
        case 0x18:
        case 0x19:
        case 0x1a:
        case 0x1b:
          goto switchD_0058c46a_caseD_16;
        }
        if (iVar3 == 0) goto switchD_0058bdde_caseD_0;
switchD_0058c46a_caseD_16:
        ptr = (char *)((byte *)ptr + (long)ppcVar7);
      } while( true );
    case 0x16:
    case 0x18:
      lVar6 = 2;
      goto LAB_0058bf66;
    }
    if (iVar3 != 0) {
LAB_0058bf66:
      ptr = ptr + lVar6;
      do {
        lVar6 = (long)end - (long)ptr;
        if (lVar6 < 1) {
          return -1;
        }
        uVar10 = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
        uVar9 = uVar10 - 5;
        if (0x18 < uVar9) goto switchD_0058bdde_caseD_0;
        ppcVar7 = (char **)&DAT_00000001;
        switch(uVar10) {
        case 5:
          if (lVar6 == 1) {
            return -2;
          }
          iVar3 = (*enc[3].nameLength)(enc,ptr);
          if (iVar3 != 0) goto switchD_0058bdde_caseD_0;
          iVar3 = (*enc[3].scanners[0])(enc,ptr,extraout_RDX_02,ppcVar7);
          ppcVar7 = (char **)&DAT_00000002;
          break;
        case 6:
          if (lVar6 < 3) {
            return -2;
          }
          pcVar4 = (*enc[3].skipS)(enc,ptr);
          if ((int)pcVar4 != 0) goto switchD_0058bdde_caseD_0;
          iVar3 = (*enc[3].scanners[1])(enc,ptr,extraout_RDX_04,ppcVar7);
          ppcVar7 = (char **)0x3;
          break;
        case 7:
          if (lVar6 < 4) {
            return -2;
          }
          iVar3 = (*enc[3].getAtts)(enc,ptr,(&switchD_0058bfa6::switchdataD_0074d9b8)[uVar9] +
                                            0x74d9b8,(ATTRIBUTE *)&DAT_00000001);
          if (iVar3 != 0) goto switchD_0058bdde_caseD_0;
          iVar3 = (*enc[3].scanners[2])(enc,ptr,extraout_RDX_03,ppcVar7);
          ppcVar7 = (char **)0x4;
          break;
        default:
          goto switchD_0058bdde_caseD_0;
        case 9:
        case 10:
        case 0x15:
          ptr = (char *)((byte *)ptr + 1);
          pAVar5 = (ATTRIBUTE *)(end + -(long)ptr);
          if ((long)pAVar5 < 1) {
            return -1;
          }
          goto LAB_0058c381;
        case 0xb:
          goto switchD_0058bfa6_caseD_b;
        case 0x11:
          goto switchD_0058bfa6_caseD_11;
        case 0x16:
        case 0x18:
        case 0x19:
        case 0x1a:
        case 0x1b:
          goto switchD_0058bfa6_caseD_16;
        }
        if (iVar3 == 0) goto switchD_0058bdde_caseD_0;
switchD_0058bfa6_caseD_16:
        ptr = (char *)((byte *)ptr + (long)ppcVar7);
      } while( true );
    }
switchD_0058bf5f_caseD_8:
    *nextTokPtr = (char *)pbVar11;
    return 0;
  case 3:
    iVar3 = normal_scanRef(enc,ptr + 1,end,nextTokPtr);
    return iVar3;
  case 4:
    pbVar8 = (byte *)(ptr + 1);
    if ((byte *)end == pbVar8 || (long)end - (long)pbVar8 < 0) {
      return -5;
    }
    if (*pbVar8 == 0x5d) {
      ptr = ptr + 2;
      if (end == ptr || (long)end - (long)ptr < 0) {
        return -5;
      }
      if (*ptr == 0x3e) break;
    }
    goto joined_r0x0058c06d;
  case 5:
    if ((long)end - (long)ptr < 2) {
      return -2;
    }
    iVar3 = (*enc[3].nameLength)(enc,ptr);
    if (iVar3 == 0) {
      pcVar4 = extraout_RDX_00;
      pbVar8 = (byte *)(ptr + 2);
      goto joined_r0x0058c06d;
    }
    break;
  case 6:
    if ((long)end - (long)ptr < 3) {
      return -2;
    }
    pcVar4 = (*enc[3].skipS)(enc,ptr);
    if ((int)pcVar4 == 0) {
      pcVar4 = extraout_RDX;
      pbVar8 = (byte *)(ptr + 3);
      goto joined_r0x0058c06d;
    }
    break;
  case 7:
    if ((long)(end + -(long)ptr) < 4) {
      return -2;
    }
    iVar3 = (*enc[3].getAtts)(enc,ptr,(int)end,(ATTRIBUTE *)(end + -(long)ptr));
    if (iVar3 == 0) {
      pcVar4 = extraout_RDX_01;
      pbVar8 = (byte *)(ptr + 4);
      goto joined_r0x0058c06d;
    }
    break;
  case 9:
    pcVar4 = ptr + 1;
    if (end != pcVar4 && -1 < (long)end - (long)pcVar4) {
      if (*(char *)((long)enc[1].scanners + (ulong)(byte)ptr[1]) == '\n') {
        pcVar4 = ptr + 2;
      }
      *nextTokPtr = pcVar4;
      return 7;
    }
    return -3;
  case 10:
    *nextTokPtr = ptr + 1;
    return 7;
  default:
    pbVar8 = (byte *)(ptr + 1);
joined_r0x0058c06d:
    while( true ) {
      pbVar11 = pbVar8;
      lVar6 = (long)end - (long)pbVar11;
      if (lVar6 < 1) {
        *nextTokPtr = (char *)pbVar11;
        return 6;
      }
      bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar11);
      if ((ulong)bVar1 < 0xb) break;
      pbVar8 = pbVar11 + 1;
    }
    switch(bVar1) {
    case 4:
      if (lVar6 == 1) break;
      pbVar8 = pbVar11 + 1;
      if (pbVar11[1] != 0x5d) goto joined_r0x0058c06d;
      if (lVar6 < 3) break;
      if (pbVar11[2] == 0x3e) goto LAB_0058c2f0;
      goto joined_r0x0058c06d;
    case 5:
      if ((lVar6 != 1) && (iVar3 = (*enc[3].nameLength)(enc,(char *)pbVar11), iVar3 == 0)) {
        pcVar4 = extraout_RDX_06;
        pbVar8 = pbVar11 + 2;
        goto joined_r0x0058c06d;
      }
      break;
    case 6:
      if ((2 < lVar6) && (pcVar4 = (*enc[3].skipS)(enc,(char *)pbVar11), (int)pcVar4 == 0)) {
        pcVar4 = extraout_RDX_05;
        pbVar8 = pbVar11 + 3;
        goto joined_r0x0058c06d;
      }
      break;
    case 7:
      if ((3 < lVar6) &&
         (iVar3 = (*enc[3].getAtts)(enc,(char *)pbVar11,(int)pcVar4,
                                    (ATTRIBUTE *)
                                    ((long)&switchD_0058c099::switchdataD_0074da80 +
                                    (long)(int)(&switchD_0058c099::switchdataD_0074da80)[bVar1])),
         iVar3 == 0)) {
        pcVar4 = extraout_RDX_07;
        pbVar8 = pbVar11 + 4;
        goto joined_r0x0058c06d;
      }
    }
    *nextTokPtr = (char *)pbVar11;
    return 6;
  }
switchD_0058bdde_caseD_0:
  *nextTokPtr = ptr;
  return 0;
LAB_0058c2f0:
  pbVar11 = pbVar11 + 2;
  goto switchD_0058bf5f_caseD_8;
LAB_0058c381:
  uVar10 = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
  uVar9 = uVar10 - 5;
  if (uVar9 < 0x19) {
    switch(uVar10) {
    case 5:
      if (pAVar5 == (ATTRIBUTE *)&DAT_00000001) {
        return -2;
      }
      iVar3 = (*enc[3].nameLength)(enc,ptr);
      if (iVar3 != 0) goto switchD_0058bdde_caseD_0;
      iVar3 = (*enc[3].literalScanners[0])(enc,ptr,extraout_RDX_18,&pAVar5->name);
      lVar6 = 3;
      break;
    case 6:
      if (pAVar5 < (ATTRIBUTE *)0x3) {
        return -2;
      }
      pcVar4 = (*enc[3].skipS)(enc,ptr);
      if ((int)pcVar4 != 0) goto switchD_0058bdde_caseD_0;
      iVar3 = (*enc[3].literalScanners[1])(enc,ptr,extraout_RDX_17,&pAVar5->name);
      lVar6 = 4;
      break;
    case 7:
      if (pAVar5 < (ATTRIBUTE *)0x4) {
        return -2;
      }
      iVar3 = (*enc[3].getAtts)(enc,ptr,(&switchD_0058c3a2::switchdataD_0074da1c)[uVar9] + 0x74da1c,
                                pAVar5);
      if (iVar3 != 0) goto switchD_0058bdde_caseD_0;
      iVar3 = (*enc[3].nameMatchesAscii)(enc,ptr,extraout_RDX_19,(char *)pAVar5);
      lVar6 = 5;
      break;
    default:
      goto switchD_0058bdde_caseD_0;
    case 9:
    case 10:
    case 0x15:
      goto switchD_0058c3a2_caseD_9;
    case 0xb:
      goto switchD_0058bfa6_caseD_b;
    case 0x11:
      goto switchD_0058bfa6_caseD_11;
    case 0x16:
    case 0x18:
      lVar6 = 2;
      goto LAB_0058c56d;
    }
    if (iVar3 != 0) {
LAB_0058c56d:
      iVar3 = normal_scanAtts(enc,(char *)((byte *)ptr + lVar6 + -1),end,nextTokPtr);
      return iVar3;
    }
  }
  goto switchD_0058bdde_caseD_0;
switchD_0058c3a2_caseD_9:
  ptr = (char *)((byte *)ptr + 1);
  pAVar5 = (ATTRIBUTE *)&pAVar5[-1].field_0x1f;
  if ((long)pAVar5 < 1) {
    return -1;
  }
  goto LAB_0058c381;
switchD_0058bfa6_caseD_b:
  *nextTokPtr = (char *)((byte *)ptr + 1);
  return 2;
switchD_0058bfa6_caseD_11:
  pbVar8 = (byte *)ptr + 1;
  if ((byte *)end == pbVar8 || (long)end - (long)pbVar8 < 0) {
    return -1;
  }
  if (*pbVar8 == 0x3e) {
    *nextTokPtr = (char *)((byte *)ptr + 2);
    return 4;
  }
LAB_0058c560:
  *nextTokPtr = (char *)pbVar8;
  return 0;
}

Assistant:

static int PTRCALL
PREFIX(contentTok)(const ENCODING *enc, const char *ptr, const char *end,
                   const char **nextTokPtr) {
  if (ptr >= end)
    return XML_TOK_NONE;
  if (MINBPC(enc) > 1) {
    size_t n = end - ptr;
    if (n & (MINBPC(enc) - 1)) {
      n &= ~(MINBPC(enc) - 1);
      if (n == 0)
        return XML_TOK_PARTIAL;
      end = ptr + n;
    }
  }
  switch (BYTE_TYPE(enc, ptr)) {
  case BT_LT:
    return PREFIX(scanLt)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_AMP:
    return PREFIX(scanRef)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_CR:
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return XML_TOK_TRAILING_CR;
    if (BYTE_TYPE(enc, ptr) == BT_LF)
      ptr += MINBPC(enc);
    *nextTokPtr = ptr;
    return XML_TOK_DATA_NEWLINE;
  case BT_LF:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_DATA_NEWLINE;
  case BT_RSQB:
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return XML_TOK_TRAILING_RSQB;
    if (! CHAR_MATCHES(enc, ptr, ASCII_RSQB))
      break;
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return XML_TOK_TRAILING_RSQB;
    if (! CHAR_MATCHES(enc, ptr, ASCII_GT)) {
      ptr -= MINBPC(enc);
      break;
    }
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
    INVALID_CASES(ptr, nextTokPtr)
  default:
    ptr += MINBPC(enc);
    break;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
#  define LEAD_CASE(n)                                                         \
  case BT_LEAD##n:                                                             \
    if (end - ptr < n || IS_INVALID_CHAR(enc, ptr, n)) {                       \
      *nextTokPtr = ptr;                                                       \
      return XML_TOK_DATA_CHARS;                                               \
    }                                                                          \
    ptr += n;                                                                  \
    break;
      LEAD_CASE(2)
      LEAD_CASE(3)
      LEAD_CASE(4)
#  undef LEAD_CASE
    case BT_RSQB:
      if (HAS_CHARS(enc, ptr, end, 2)) {
        if (! CHAR_MATCHES(enc, ptr + MINBPC(enc), ASCII_RSQB)) {
          ptr += MINBPC(enc);
          break;
        }
        if (HAS_CHARS(enc, ptr, end, 3)) {
          if (! CHAR_MATCHES(enc, ptr + 2 * MINBPC(enc), ASCII_GT)) {
            ptr += MINBPC(enc);
            break;
          }
          *nextTokPtr = ptr + 2 * MINBPC(enc);
          return XML_TOK_INVALID;
        }
      }
      /* fall through */
    case BT_AMP:
    case BT_LT:
    case BT_NONXML:
    case BT_MALFORM:
    case BT_TRAIL:
    case BT_CR:
    case BT_LF:
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  *nextTokPtr = ptr;
  return XML_TOK_DATA_CHARS;
}